

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Launcher.cpp
# Opt level: O0

shared_ptr<DTree> __thiscall Launcher::getDTree(Launcher *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<DTree> *in_RSI;
  element_type *in_RDI;
  shared_ptr<DTree> sVar1;
  
  std::shared_ptr<DTree>::shared_ptr(in_RSI,(shared_ptr<DTree> *)in_RDI);
  sVar1.super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<DTree>)sVar1.super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<DTree> Launcher::getDTree()
{
	return _dTree;
}